

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<double>::Initialize(TPZBlockDiagonal<double> *this,TPZVec<int> *blocksize)

{
  long lVar1;
  double *copy;
  int *piVar2;
  long *plVar3;
  int iVar4;
  TPZVec<double> *in_RSI;
  TPZVec<int> *in_RDI;
  int bsize;
  int64_t neq;
  int64_t ndata;
  int64_t b;
  int64_t nblock;
  TPZVec<int> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int64_t in_stack_ffffffffffffffc8;
  int *newsize;
  TPZVec<long> *in_stack_ffffffffffffffd0;
  TPZVec<double> *this_00;
  long numelem;
  int64_t from;
  
  copy = (double *)TPZVec<int>::NElements((TPZVec<int> *)in_RSI);
  TPZVec<int>::operator=(in_stack_ffffffffffffffb0,in_RDI);
  from = 0;
  TPZVec<long>::Resize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (long *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  this_00 = (TPZVec<double> *)0x0;
  newsize = (int *)0x0;
  for (numelem = 0; numelem < (long)copy; numelem = numelem + 1) {
    piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)in_RSI,numelem);
    in_stack_ffffffffffffffc4 = *piVar2;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 2),numelem);
    lVar1 = *plVar3;
    iVar4 = in_stack_ffffffffffffffc4 * in_stack_ffffffffffffffc4;
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 2),numelem + 1);
    *plVar3 = lVar1 + iVar4;
    this_00 = (TPZVec<double> *)
              ((long)&this_00->_vptr_TPZVec +
              (long)(in_stack_ffffffffffffffc4 * in_stack_ffffffffffffffc4));
    newsize = (int *)((long)in_stack_ffffffffffffffc4 + (long)newsize);
  }
  TPZVec<double>::Fill(in_RSI,copy,from,numelem);
  TPZVec<double>::Resize
            (this_00,(int64_t)newsize,
             (double *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  *(undefined1 *)&in_RDI->fNAlloc = 0;
  in_RDI->fStore = newsize;
  in_RDI->fNElements = (int64_t)newsize;
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::Initialize(const TPZVec<int> &blocksize){
	int64_t nblock = blocksize.NElements();
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Number of blocks \t" << nblock;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	fBlockSize = blocksize;
	fBlockPos.Resize(nblock+1,0); 
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksize[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
#ifdef PZ_LOG
	if(ndata > 10000000)
	{
		std::stringstream sout;
		sout << "Calling fStorage.Resize(ndata,0.) with ndata = " << ndata;
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	
	fStorage.Fill(0.,0);
	fStorage.Resize(ndata,0.);
	this->fDecomposed = 0;
	this->fRow = neq;
	this->fCol = neq;
}